

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  FormatterBase *this;
  App *pAVar1;
  ostream *poVar2;
  ParseError *e;
  string local_568;
  allocator local_541;
  string local_540;
  allocator local_519;
  string local_518;
  App *local_4f8;
  App *sub2;
  string local_4e8;
  allocator local_4c1;
  string local_4c0;
  allocator local_499;
  string local_498;
  App *local_478;
  App *sub1;
  string local_468;
  shared_ptr<CLI::FormatterBase> local_448;
  undefined1 local_438 [8];
  shared_ptr<MyFormatter> fmt;
  string local_420;
  allocator local_3f9;
  string local_3f8;
  allocator local_3d1;
  string local_3d0;
  allocator local_399;
  string local_398;
  undefined1 local_378 [8];
  App app;
  char **argv_local;
  int argc_local;
  
  app.config_formatter_.super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_398,"",&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3d0,"",&local_3d1);
  CLI::App::App((App *)local_378,&local_398,&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3f8,"--help-all",&local_3f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_420,"Show all help",
             (allocator *)
             ((long)&fmt.super___shared_ptr<MyFormatter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  CLI::App::set_help_all_flag((App *)local_378,&local_3f8,&local_420);
  std::__cxx11::string::~string((string *)&local_420);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&fmt.super___shared_ptr<MyFormatter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  std::__cxx11::string::~string((string *)&local_3f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  CLI::std::make_shared<MyFormatter>();
  this = (FormatterBase *)
         CLI::std::__shared_ptr_access<MyFormatter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<MyFormatter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    local_438);
  CLI::FormatterBase::column_width(this,0xf);
  std::shared_ptr<CLI::FormatterBase>::shared_ptr<MyFormatter,void>
            (&local_448,(shared_ptr<MyFormatter> *)local_438);
  CLI::App::formatter((App *)local_378,&local_448);
  CLI::std::shared_ptr<CLI::FormatterBase>::~shared_ptr(&local_448);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_468,"--flag",(allocator *)((long)&sub1 + 7));
  CLI::App::add_flag<const_char[15],_(CLI::detail::enabler)0>
            ((App *)local_378,&local_468,(char (*) [15])"This is a flag");
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator((allocator<char> *)((long)&sub1 + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_498,"one",&local_499);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4c0,"Description One",&local_4c1);
  pAVar1 = CLI::App::add_subcommand((App *)local_378,&local_498,&local_4c0);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator((allocator<char> *)&local_499);
  local_478 = pAVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4e8,"--oneflag",(allocator *)((long)&sub2 + 7));
  CLI::App::add_flag<const_char[10],_(CLI::detail::enabler)0>
            (pAVar1,&local_4e8,(char (*) [10])"Some flag");
  std::__cxx11::string::~string((string *)&local_4e8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&sub2 + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_518,"two",&local_519);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_540,"Description Two",&local_541);
  pAVar1 = CLI::App::add_subcommand((App *)local_378,&local_518,&local_540);
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  local_4f8 = pAVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_568,"--twoflag",(allocator *)((long)&e + 7));
  CLI::App::add_flag<const_char[16],_(CLI::detail::enabler)0>
            (pAVar1,&local_568,(char (*) [16])"Some other flag");
  std::__cxx11::string::~string((string *)&local_568);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  CLI::App::parse((App *)local_378,argc,
                  (char **)app.config_formatter_.
                           super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "This app was meant to show off the formatter, run with -h");
  std::operator<<(poVar2,'\n');
  CLI::std::shared_ptr<MyFormatter>::~shared_ptr((shared_ptr<MyFormatter> *)local_438);
  CLI::App::~App((App *)local_378);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    CLI::App app;
    app.set_help_all_flag("--help-all", "Show all help");

    auto fmt = std::make_shared<MyFormatter>();
    fmt->column_width(15);
    app.formatter(fmt);

    app.add_flag("--flag", "This is a flag");

    auto *sub1 = app.add_subcommand("one", "Description One");
    sub1->add_flag("--oneflag", "Some flag");
    auto *sub2 = app.add_subcommand("two", "Description Two");
    sub2->add_flag("--twoflag", "Some other flag");

    CLI11_PARSE(app, argc, argv);

    std::cout << "This app was meant to show off the formatter, run with -h" << '\n';

    return 0;
}